

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

bool __thiscall
re2::DFA::InlinedSearchLoop
          (DFA *this,SearchParams *params,bool have_firstbyte,bool want_earliest_match,
          bool run_forward)

{
  byte bVar1;
  Prog *pPVar2;
  char *pcVar3;
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar4;
  bool bVar5;
  uint uVar6;
  byte *pbVar7;
  void *pvVar8;
  State *pSVar9;
  State *pSVar10;
  State *pSVar11;
  undefined7 in_register_00000009;
  uint c;
  long lVar12;
  undefined7 in_register_00000081;
  byte *pbVar13;
  byte *pbVar14;
  Inst *this_01;
  byte *pbVar15;
  byte *__s;
  bool bVar16;
  StateSaver save_start;
  StateSaver save_s;
  uint local_244;
  byte *local_240;
  byte *local_238;
  StateSaver local_200;
  StateSaver local_1d8;
  LogMessageFatal local_1b0;
  
  __s = (byte *)(params->text).ptr_;
  pbVar13 = __s + (params->text).length_;
  bVar16 = (int)CONCAT71(in_register_00000081,run_forward) != 0;
  pbVar7 = pbVar13;
  if (bVar16) {
    pbVar7 = __s;
  }
  pSVar11 = params->start;
  pbVar14 = __s;
  if (bVar16) {
    pbVar14 = pbVar13;
  }
  if ((pSVar11->flag_ >> 0xc & (uint)CONCAT71(in_register_00000009,want_earliest_match)) == 0) {
    pPVar2 = this->prog_;
    uVar6 = pSVar11->flag_ & 0x1000;
    local_244 = uVar6 >> 0xc;
    local_238 = (byte *)0x0;
    local_240 = (byte *)0x0;
    if (uVar6 != 0) {
      local_240 = pbVar7;
    }
    pSVar10 = pSVar11;
    do {
      do {
        bVar16 = SUB41(local_244,0);
        if ((long)pbVar7 - (long)pbVar14 == 0) {
          pbVar13 = pbVar7;
          __s = pbVar7;
          if (run_forward) {
LAB_00139506:
            pbVar7 = (byte *)((params->text).ptr_ + (params->text).length_);
            __s = pbVar13;
            if (pbVar7 != (byte *)((params->context).ptr_ + (params->context).length_))
            goto LAB_00139535;
LAB_0013954a:
            uVar6 = this->prog_->bytemap_range_;
            c = 0x100;
            __s = pbVar13;
          }
          else {
LAB_00139525:
            pcVar3 = (params->text).ptr_;
            pbVar13 = __s;
            if (pcVar3 == (params->context).ptr_) goto LAB_0013954a;
            pbVar7 = (byte *)(pcVar3 + -1);
LAB_00139535:
            c = (uint)*pbVar7;
            uVar6 = (uint)this->prog_->bytemap_[*pbVar7];
          }
          pSVar11 = (State *)(&pSVar10[1].inst_)[(int)uVar6];
          if ((pSVar11 == (State *)0x0) &&
             (pSVar11 = RunStateOnByteUnlocked(this,pSVar10,c), pSVar11 == (State *)0x0)) {
            StateSaver::StateSaver(&local_200,this,pSVar10);
            ResetCache(this,params->cache_lock);
            pSVar11 = StateSaver::Restore(&local_200);
            if (pSVar11 == (State *)0x0) {
LAB_00139619:
              params->failed = true;
              bVar5 = false;
              pSVar11 = (State *)0x0;
            }
            else {
              pSVar11 = RunStateOnByteUnlocked(this,pSVar11,c);
              if (pSVar11 == (State *)0x0) {
                LogMessageFatal::LogMessageFatal
                          (&local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc"
                           ,0x5ce);
                std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                                "RunStateOnByteUnlocked failed after Reset");
                LogMessageFatal::~LogMessageFatal(&local_1b0);
                goto LAB_00139619;
              }
              bVar5 = true;
            }
            StateSaver::~StateSaver(&local_200);
            if (!bVar5) {
              return false;
            }
          }
          if (pSVar11 != (State *)0x2) {
            if (((State *)0x2 < pSVar11) && ((pSVar11->flag_ & 0x1000) != 0)) {
              this_00 = params->matches;
              bVar16 = true;
              local_240 = __s;
              if ((this_00 != (vector<int,_std::allocator<int>_> *)0x0) &&
                 (this->kind_ == kManyMatch)) {
                piVar4 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish != piVar4) {
                  (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = piVar4;
                }
                for (lVar12 = 0; lVar12 < pSVar11->ninst_; lVar12 = lVar12 + 1) {
                  this_01 = this->prog_->inst_ + pSVar11->inst_[lVar12];
                  do {
                    uVar6 = this_01->out_opcode_;
                    if ((uVar6 & 7) == 5) {
                      local_1b0.super_LogMessage.severity_ = Prog::Inst::match_id(this_01);
                      std::vector<int,_std::allocator<int>_>::emplace_back<int>
                                (this_00,(int *)&local_1b0);
                      uVar6 = this_01->out_opcode_;
                    }
                    this_01 = this_01 + 1;
                  } while ((uVar6 & 8) == 0);
                }
                bVar16 = true;
              }
            }
            params->ep = (char *)local_240;
            return bVar16;
          }
          goto LAB_001396f9;
        }
        if ((have_firstbyte) && (pSVar10 == pSVar11)) {
          if (!run_forward) {
            pvVar8 = memrchr(__s,params->firstbyte,(long)pbVar7 - (long)pbVar14);
            if (pvVar8 == (void *)0x0) goto LAB_00139525;
            pbVar7 = (byte *)((long)pvVar8 + 1);
            goto LAB_0013934a;
          }
          pbVar7 = (byte *)memchr(pbVar7,params->firstbyte,(long)pbVar14 - (long)pbVar7);
          if (pbVar7 == (byte *)0x0) goto LAB_00139506;
LAB_00139329:
          pbVar15 = pbVar7 + 1;
        }
        else {
          if (run_forward) goto LAB_00139329;
LAB_0013934a:
          pbVar7 = pbVar7 + -1;
          pbVar15 = pbVar7;
        }
        bVar1 = *pbVar7;
        pSVar9 = (State *)(&pSVar10[1].inst_)[pPVar2->bytemap_[bVar1]];
        if (pSVar9 == (State *)0x0) {
          pSVar9 = RunStateOnByteUnlocked(this,pSVar10,(uint)bVar1);
          if (pSVar9 == (State *)0x0) {
            if (((FLAGS_re2_dfa_bail_when_slow == '\x01') && (local_238 != (byte *)0x0)) &&
               ((ulong)((long)pbVar15 - (long)local_238) <
                (this->state_cache_)._M_h._M_element_count * 10)) {
              params->failed = true;
              return false;
            }
            StateSaver::StateSaver(&local_200,this,pSVar11);
            StateSaver::StateSaver(&local_1d8,this,pSVar10);
            ResetCache(this,params->cache_lock);
            pSVar11 = StateSaver::Restore(&local_200);
            if ((pSVar11 == (State *)0x0) ||
               (pSVar10 = StateSaver::Restore(&local_1d8), pSVar10 == (State *)0x0)) {
LAB_001394a4:
              params->failed = true;
              bVar5 = false;
              pSVar9 = (State *)0x0;
            }
            else {
              pSVar9 = RunStateOnByteUnlocked(this,pSVar10,(uint)bVar1);
              if (pSVar9 == (State *)0x0) {
                LogMessageFatal::LogMessageFatal
                          (&local_1b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc"
                           ,0x58e);
                std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                                "RunStateOnByteUnlocked failed after ResetCache");
                LogMessageFatal::~LogMessageFatal(&local_1b0);
                goto LAB_001394a4;
              }
              bVar5 = true;
            }
            StateSaver::~StateSaver(&local_1d8);
            StateSaver::~StateSaver(&local_200);
            local_238 = pbVar15;
            if (!bVar5) {
              return false;
            }
          }
        }
        if (pSVar9 < (State *)0x3) {
          if (pSVar9 == (State *)0x1) {
            params->ep = (char *)local_240;
            return bVar16;
          }
LAB_001396f9:
          params->ep = (char *)pbVar14;
          return true;
        }
        pSVar10 = pSVar9;
        pbVar7 = pbVar15;
      } while ((pSVar9->flag_ & 0x1000) == 0);
      local_240 = pbVar15 + (-(ulong)run_forward | 1);
      local_244 = 1;
    } while (!want_earliest_match);
    params->ep = (char *)local_240;
  }
  else {
    params->ep = (char *)pbVar7;
  }
  return true;
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params,
                                   bool have_firstbyte,
                                   bool want_earliest_match,
                                   bool run_forward) {
  State* start = params->start;
  const uint8* bp = BytePtr(params->text.begin());  // start of text
  const uint8* p = bp;                              // text scanning point
  const uint8* ep = BytePtr(params->text.end());    // end of text
  const uint8* resetp = NULL;                       // p at last cache reset
  if (!run_forward)
    swap(p, ep);

  const uint8* bytemap = prog_->bytemap();
  const uint8* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;
  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {
    if (DebugDFA)
      fprintf(stderr, "@%d: %s\n", static_cast<int>(p - bp),
              DumpState(s).c_str());
    if (have_firstbyte && s == start) {
      // In start state, only way out is to find firstbyte,
      // so use optimized assembly in memchr to skip ahead.
      // If firstbyte isn't found, we can skip to the end
      // of the string.
      if (run_forward) {
        if ((p = BytePtr(memchr(p, params->firstbyte, ep - p))) == NULL) {
          p = ep;
          break;
        }
      } else {
        if ((p = BytePtr(memrchr(ep, params->firstbyte, p - ep))) == NULL) {
          p = ep;
          break;
        }
        p++;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.
        if (FLAGS_re2_dfa_bail_when_slow && resetp != NULL &&
            static_cast<unsigned long>(p - resetp) < 10*state_cache_.size()) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }
    s = ns;

    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (DebugDFA)
        fprintf(stderr, "match @%d! [%s]\n",
                static_cast<int>(lastmatch - bp),
                DumpState(s).c_str());

      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)
  int lastbyte;
  if (run_forward) {
    if (params->text.end() == params->context.end())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.end()[0] & 0xFF;
  } else {
    if (params->text.begin() == params->context.begin())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.begin()[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  s = ns;
  if (DebugDFA)
    fprintf(stderr, "@_: %s\n", DumpState(s).c_str());
  if (s == FullMatchState) {
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }
  if (s > SpecialStateMax && s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches && kind_ == Prog::kManyMatch) {
      vector<int>* v = params->matches;
      v->clear();
      for (int i = 0; i < s->ninst_; i++) {
        Prog::Inst* ip = prog_->inst(s->inst_[i]);
        for (;;) {
          if (ip->opcode() == kInstMatch)
            v->push_back(ip->match_id());
          if (ip->last())
            break;
          ip++;
        }
      }
    }
    if (DebugDFA)
      fprintf(stderr, "match @%d! [%s]\n", static_cast<int>(lastmatch - bp),
              DumpState(s).c_str());
  }
  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}